

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Upsert * sqlite3UpsertOfIndex(Upsert *pUpsert,Index *pIdx)

{
  bool bVar1;
  Index *pIdx_local;
  Upsert *pUpsert_local;
  
  pIdx_local = (Index *)pUpsert;
  while( true ) {
    bVar1 = false;
    if ((pIdx_local != (Index *)0x0) && (bVar1 = false, pIdx_local->zName != (char *)0x0)) {
      bVar1 = (Index *)pIdx_local->aSortOrder != pIdx;
    }
    if (!bVar1) break;
    pIdx_local = (Index *)pIdx_local->zColAff;
  }
  return (Upsert *)pIdx_local;
}

Assistant:

SQLITE_PRIVATE Upsert *sqlite3UpsertOfIndex(Upsert *pUpsert, Index *pIdx){
  while(
      pUpsert
   && pUpsert->pUpsertTarget!=0
   && pUpsert->pUpsertIdx!=pIdx
  ){
     pUpsert = pUpsert->pNextUpsert;
  }
  return pUpsert;
}